

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O0

void SetupMapping(aiMaterial *mat,aiTextureMapping mode,aiVector3D *axis)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  aiMaterialProperty *paVar4;
  char *pcVar5;
  size_type sVar6;
  ulong uVar7;
  aiMaterialProperty **ppaVar8;
  reference __src;
  aiMaterialProperty *local_58;
  aiMaterialProperty *m;
  aiMaterialProperty *prop;
  uint i;
  undefined1 local_38 [8];
  vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_> p;
  aiVector3D *axis_local;
  aiTextureMapping mode_local;
  aiMaterial *mat_local;
  
  p.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)axis;
  std::vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>::vector
            ((vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_> *)local_38);
  std::vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>::reserve
            ((vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_> *)local_38,
             (ulong)(mat->mNumProperties + 1));
  for (prop._0_4_ = 0; (uint)prop < mat->mNumProperties; prop._0_4_ = (uint)prop + 1) {
    m = mat->mProperties[(uint)prop];
    iVar3 = strcmp((m->mKey).data,"$tex.file");
    if (iVar3 == 0) {
      paVar4 = (aiMaterialProperty *)operator_new(0x420);
      aiMaterialProperty::aiMaterialProperty(paVar4);
      local_58 = paVar4;
      aiString::Set((aiString *)paVar4,"$tex.mapping");
      local_58->mIndex = m->mIndex;
      local_58->mSemantic = m->mSemantic;
      local_58->mType = aiPTI_Integer;
      local_58->mDataLength = 4;
      pcVar5 = (char *)operator_new__(4);
      local_58->mData = pcVar5;
      *(aiTextureMapping *)local_58->mData = mode;
      std::vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>::push_back
                ((vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_> *)local_38,&m)
      ;
      std::vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>::push_back
                ((vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_> *)local_38,
                 &local_58);
      if (((mode == aiTextureMapping_CYLINDER) || (mode == aiTextureMapping_PLANE)) ||
         (mode == aiTextureMapping_SPHERE)) {
        paVar4 = (aiMaterialProperty *)operator_new(0x420);
        aiMaterialProperty::aiMaterialProperty(paVar4);
        local_58 = paVar4;
        aiString::Set((aiString *)paVar4,"$tex.mapaxis");
        local_58->mIndex = m->mIndex;
        local_58->mSemantic = m->mSemantic;
        local_58->mType = aiPTI_Float;
        local_58->mDataLength = 0xc;
        pcVar5 = (char *)operator_new__(0xc);
        local_58->mData = pcVar5;
        pcVar5 = local_58->mData;
        *(undefined4 *)(pcVar5 + 8) =
             *(undefined4 *)
              (p.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        *(aiMaterialProperty **)pcVar5 =
             *p.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>::push_back
                  ((vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_> *)local_38,
                   &local_58);
      }
    }
    else {
      iVar3 = strcmp((m->mKey).data,"$tex.uvwsrc");
      if (iVar3 == 0) {
        paVar4 = mat->mProperties[(uint)prop];
        if (paVar4 != (aiMaterialProperty *)0x0) {
          aiMaterialProperty::~aiMaterialProperty(paVar4);
          operator_delete(paVar4,0x420);
        }
      }
      else {
        std::vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>::push_back
                  ((vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_> *)local_38,
                   &m);
      }
    }
  }
  bVar2 = std::vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>::empty
                    ((vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_> *)local_38
                    );
  if (!bVar2) {
    sVar6 = std::vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>::size
                      ((vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_> *)
                       local_38);
    if (mat->mNumAllocated < sVar6) {
      if (mat->mProperties != (aiMaterialProperty **)0x0) {
        operator_delete__(mat->mProperties);
      }
      sVar6 = std::vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>::size
                        ((vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_> *)
                         local_38);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = sVar6 * 2;
      uVar7 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar7 = 0xffffffffffffffff;
      }
      ppaVar8 = (aiMaterialProperty **)operator_new__(uVar7);
      mat->mProperties = ppaVar8;
      sVar6 = std::vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>::size
                        ((vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_> *)
                         local_38);
      mat->mNumAllocated = (uint)(sVar6 << 1);
    }
    sVar6 = std::vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>::size
                      ((vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_> *)
                       local_38);
    mat->mNumProperties = (uint)sVar6;
    ppaVar8 = mat->mProperties;
    __src = std::vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>::operator[]
                      ((vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_> *)
                       local_38,0);
    memcpy(ppaVar8,__src,(ulong)mat->mNumProperties << 3);
  }
  std::vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>::~vector
            ((vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_> *)local_38);
  return;
}

Assistant:

void SetupMapping (aiMaterial* mat, aiTextureMapping mode, const aiVector3D& axis = aiVector3D(0.f,0.f,-1.f))
{
    // Check whether there are texture properties defined - setup
    // the desired texture mapping mode for all of them and ignore
    // all UV settings we might encounter. WE HAVE NO UVS!

    std::vector<aiMaterialProperty*> p;
    p.reserve(mat->mNumProperties+1);

    for (unsigned int i = 0; i < mat->mNumProperties;++i)
    {
        aiMaterialProperty* prop = mat->mProperties[i];
        if (!::strcmp( prop->mKey.data, "$tex.file"))   {
            // Setup the mapping key
            aiMaterialProperty* m = new aiMaterialProperty();
            m->mKey.Set("$tex.mapping");
            m->mIndex    = prop->mIndex;
            m->mSemantic = prop->mSemantic;
            m->mType     = aiPTI_Integer;

            m->mDataLength = 4;
            m->mData = new char[4];
            *((int*)m->mData) = mode;

            p.push_back(prop);
            p.push_back(m);

            // Setup the mapping axis
            if (mode == aiTextureMapping_CYLINDER || mode == aiTextureMapping_PLANE || mode == aiTextureMapping_SPHERE) {
                m = new aiMaterialProperty();
                m->mKey.Set("$tex.mapaxis");
                m->mIndex    = prop->mIndex;
                m->mSemantic = prop->mSemantic;
                m->mType     = aiPTI_Float;

                m->mDataLength = 12;
                m->mData = new char[12];
                *((aiVector3D*)m->mData) = axis;
                p.push_back(m);
            }
        }
        else if (! ::strcmp( prop->mKey.data, "$tex.uvwsrc"))   {
            delete mat->mProperties[i];
        }
        else p.push_back(prop);
    }

    if (p.empty())return;

    // rebuild the output array
    if (p.size() > mat->mNumAllocated)  {
        delete[] mat->mProperties;
        mat->mProperties = new aiMaterialProperty*[p.size()*2];

        mat->mNumAllocated = static_cast<unsigned int>(p.size()*2);
    }
    mat->mNumProperties = (unsigned int)p.size();
    ::memcpy(mat->mProperties,&p[0],sizeof(void*)*mat->mNumProperties);
}